

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_begin_phase(char *name)

{
  Variant local_40;
  undefined1 local_30 [8];
  Caliper c;
  char *name_local;
  
  c._24_8_ = name;
  cali::Caliper::Caliper((Caliper *)local_30);
  cali::Variant::Variant(&local_40,(char *)c._24_8_);
  cali::Caliper::begin((Caliper *)local_30,(Attribute *)&cali::phase_attr,&local_40);
  cali::Caliper::~Caliper((Caliper *)local_30);
  return;
}

Assistant:

void cali_begin_phase(const char* name)
{
    Caliper c;
    c.begin(cali::phase_attr, Variant(name));
}